

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O1

RandMode __thiscall slang::ast::ASTContext::getRandMode(ASTContext *this,Symbol *symbol)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  RandomizeDetails *pRVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppSVar5;
  ulong uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  RandMode RVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  undefined1 auVar19 [16];
  
  RVar9 = Symbol::getRandMode(symbol);
  if (RVar9 == None) {
    pRVar3 = this->randomizeDetails;
    if (pRVar3 != (RandomizeDetails *)0x0) {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = symbol;
      uVar12 = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar10 = uVar12 >> ((byte)(pRVar3->scopeRandVars).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<const_slang::ast::Symbol_*>_>
                                .arrays.groups_size_index & 0x3f);
      pgVar4 = (pRVar3->scopeRandVars).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<const_slang::ast::Symbol_*>_>
               .arrays.groups_;
      uVar2 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar12 & 0xff];
      uVar14 = 0;
      do {
        pgVar1 = pgVar4 + uVar10;
        uVar15 = (uchar)uVar2;
        auVar19[0] = -(pgVar1->m[0].n == uVar15);
        uVar16 = (uchar)((uint)uVar2 >> 8);
        auVar19[1] = -(pgVar1->m[1].n == uVar16);
        uVar17 = (uchar)((uint)uVar2 >> 0x10);
        auVar19[2] = -(pgVar1->m[2].n == uVar17);
        uVar18 = (uchar)((uint)uVar2 >> 0x18);
        auVar19[3] = -(pgVar1->m[3].n == uVar18);
        auVar19[4] = -(pgVar1->m[4].n == uVar15);
        auVar19[5] = -(pgVar1->m[5].n == uVar16);
        auVar19[6] = -(pgVar1->m[6].n == uVar17);
        auVar19[7] = -(pgVar1->m[7].n == uVar18);
        auVar19[8] = -(pgVar1->m[8].n == uVar15);
        auVar19[9] = -(pgVar1->m[9].n == uVar16);
        auVar19[10] = -(pgVar1->m[10].n == uVar17);
        auVar19[0xb] = -(pgVar1->m[0xb].n == uVar18);
        auVar19[0xc] = -(pgVar1->m[0xc].n == uVar15);
        auVar19[0xd] = -(pgVar1->m[0xd].n == uVar16);
        auVar19[0xe] = -(pgVar1->m[0xe].n == uVar17);
        auVar19[0xf] = -(pgVar1->m[0xf].n == uVar18);
        uVar13 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe);
        if (uVar13 != 0) {
          ppSVar5 = (pRVar3->scopeRandVars).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<const_slang::ast::Symbol_*>_>
                    .arrays.elements_;
          do {
            uVar7 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
              }
            }
            if (ppSVar5[uVar10 * 0xf + (ulong)uVar7] == symbol) {
              if (ppSVar5 + uVar10 * 0xf + (ulong)uVar7 != (value_type_pointer)0x0) {
                return Rand;
              }
              goto LAB_00431ce9;
            }
            uVar13 = uVar13 - 1 & uVar13;
          } while (uVar13 != 0);
        }
        if ((pgVar4[uVar10].m[0xf].n &
            (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar12 & 7]) == 0) break;
        uVar6 = (pRVar3->scopeRandVars).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<const_slang::ast::Symbol_*>_>
                .arrays.groups_size_mask;
        lVar11 = uVar10 + uVar14;
        uVar14 = uVar14 + 1;
        uVar10 = lVar11 + 1U & uVar6;
      } while (uVar14 <= uVar6);
    }
LAB_00431ce9:
    RVar9 = None;
  }
  return RVar9;
}

Assistant:

RandMode ASTContext::getRandMode(const Symbol& symbol) const {
    RandMode mode = symbol.getRandMode();
    if (mode != RandMode::None)
        return mode;

    if (randomizeDetails) {
        if (auto it = randomizeDetails->scopeRandVars.find(&symbol);
            it != randomizeDetails->scopeRandVars.end()) {
            return RandMode::Rand;
        }
    }

    return RandMode::None;
}